

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_event_init(ma_context *pContext,ma_event *pEvent)

{
  int e;
  ma_result mVar1;
  
  if (pEvent == (ma_event *)0x0 || pContext == (ma_context *)0x0) {
    return 0;
  }
  pEvent->pContext = pContext;
  e = (*(pContext->field_22).posix.pthread_mutex_init)(&pEvent->field_1,0);
  if (e == 0) {
    e = (*(pContext->field_22).posix.pthread_cond_init)
                  ((undefined1 *)((long)&pEvent->field_1 + 0x28),0);
    if (e == 0) {
      (pEvent->field_1).posix.value = 0;
      return 0;
    }
    (*(pEvent->pContext->field_22).posix.pthread_mutex_destroy)(&pEvent->field_1);
  }
  mVar1 = ma_result_from_errno(e);
  return mVar1;
}

Assistant:

MA_API ma_result ma_event_init(ma_context* pContext, ma_event* pEvent)
{
    if (pContext == NULL || pEvent == NULL) {
        return MA_FALSE;
    }

    pEvent->pContext = pContext;

#ifdef MA_WIN32
    return ma_event_init__win32(pContext, pEvent);
#endif
#ifdef MA_POSIX
    return ma_event_init__posix(pContext, pEvent);
#endif
}